

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O1

void __thiscall
draco::OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
          (OctahedronToolBox *this,float *vector,int32_t *out_s,int32_t *out_t)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  
  dVar12 = (double)(float)*(undefined8 *)vector;
  dVar13 = (double)(float)((ulong)*(undefined8 *)vector >> 0x20);
  auVar2._8_4_ = SUB84(dVar13,0);
  auVar2._0_8_ = dVar12;
  auVar2._12_4_ = (int)((ulong)dVar13 >> 0x20);
  dVar8 = (double)((ulong)DAT_00165ef0 & (ulong)(double)vector[2]) +
          SUB168(auVar2 & _DAT_00165ef0,8) + SUB168(auVar2 & _DAT_00165ef0,0);
  if (dVar8 <= 1e-06) {
    dVar12 = 1.0;
    dVar13 = 0.0;
    bVar3 = false;
  }
  else {
    dVar8 = 1.0 / dVar8;
    dVar12 = dVar8 * dVar12;
    dVar13 = dVar8 * dVar13;
    bVar3 = dVar8 * (double)vector[2] < 0.0;
  }
  iVar1 = this->center_value_;
  dVar12 = floor((double)iVar1 * dVar12 + 0.5);
  dVar13 = floor((double)iVar1 * dVar13 + 0.5);
  iVar10 = (int)dVar12;
  iVar11 = (int)dVar13;
  uVar9 = CONCAT44(iVar11,iVar10) ^ CONCAT44(iVar11 >> 0x1f,iVar10 >> 0x1f);
  uVar7 = iVar1 - (((int)(uVar9 >> 0x20) - (iVar11 >> 0x1f)) + ((int)uVar9 - (iVar10 >> 0x1f)));
  uVar6 = -uVar7;
  if (0 < iVar11) {
    uVar6 = uVar7;
  }
  uVar4 = ((int)uVar7 >> 0x1f & uVar6) + iVar11;
  uVar6 = 0;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  uVar7 = -uVar6;
  if (!bVar3) {
    uVar7 = uVar6;
  }
  if (iVar10 < 0) {
    uVar5 = this->max_value_ - uVar6;
    if ((int)uVar4 < 0) {
      uVar5 = uVar6;
    }
    if ((int)uVar7 < 0) {
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
    }
    else {
      uVar6 = -uVar4;
      if ((int)uVar4 < 1) {
        uVar6 = uVar4;
      }
      uVar6 = uVar6 + this->max_value_;
    }
  }
  else {
    uVar5 = uVar4 + iVar1;
    uVar6 = uVar7 + iVar1;
  }
  if (((uVar6 == 0 && uVar5 == 0) || ((uVar7 = this->max_value_, uVar5 == 0 && (uVar7 == uVar6))))
     || ((uVar6 == 0 && (uVar7 == uVar5)))) {
    uVar6 = this->max_value_;
    uVar5 = uVar6;
  }
  else if ((uVar5 == 0) && (iVar1 < (int)uVar6)) {
    uVar6 = iVar1 * 2 - uVar6;
    uVar5 = 0;
  }
  else if ((uVar7 == uVar5) && ((int)uVar6 < iVar1)) {
    uVar6 = iVar1 * 2 - uVar6;
  }
  else if (((uVar7 == uVar6) && ((int)uVar5 < iVar1)) ||
          ((uVar6 == 0 && (uVar6 = 0, iVar1 < (int)uVar5)))) {
    uVar5 = iVar1 * 2 - uVar5;
  }
  *out_s = uVar5;
  *out_t = uVar6;
  return;
}

Assistant:

void FloatVectorToQuantizedOctahedralCoords(const T *vector, int32_t *out_s,
                                              int32_t *out_t) const {
    const double abs_sum = std::abs(static_cast<double>(vector[0])) +
                           std::abs(static_cast<double>(vector[1])) +
                           std::abs(static_cast<double>(vector[2]));

    // Adjust values such that abs sum equals 1.
    double scaled_vector[3];
    if (abs_sum > 1e-6) {
      // Scale needed to project the vector to the surface of an octahedron.
      const double scale = 1.0 / abs_sum;
      scaled_vector[0] = vector[0] * scale;
      scaled_vector[1] = vector[1] * scale;
      scaled_vector[2] = vector[2] * scale;
    } else {
      scaled_vector[0] = 1.0;
      scaled_vector[1] = 0;
      scaled_vector[2] = 0;
    }

    // Scale vector such that the sum equals the center value.
    int32_t int_vec[3];
    int_vec[0] =
        static_cast<int32_t>(floor(scaled_vector[0] * center_value_ + 0.5));
    int_vec[1] =
        static_cast<int32_t>(floor(scaled_vector[1] * center_value_ + 0.5));
    // Make sure the sum is exactly the center value.
    int_vec[2] = center_value_ - std::abs(int_vec[0]) - std::abs(int_vec[1]);
    if (int_vec[2] < 0) {
      // If the sum of first two coordinates is too large, we need to decrease
      // the length of one of the coordinates.
      if (int_vec[1] > 0) {
        int_vec[1] += int_vec[2];
      } else {
        int_vec[1] -= int_vec[2];
      }
      int_vec[2] = 0;
    }
    // Take care of the sign.
    if (scaled_vector[2] < 0) {
      int_vec[2] *= -1;
    }

    IntegerVectorToQuantizedOctahedralCoords(int_vec, out_s, out_t);
  }